

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O3

void * utf8rchr(void *src,int chr)

{
  char cVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  undefined1 uVar5;
  char cVar6;
  char *pcVar7;
  char c [5];
  
  c[4] = '\0';
  if (chr == 0) {
    pvVar2 = (void *)((long)src + -1);
    do {
      pvVar3 = (void *)((long)pvVar2 + 1);
      pcVar7 = (char *)((long)pvVar2 + 1);
      pvVar2 = pvVar3;
    } while (*pcVar7 != '\0');
  }
  else {
    uVar5 = (undefined1)chr;
    if ((uint)chr < 0x80) {
      c._0_4_ = chr & 0xff;
    }
    else if ((uint)chr < 0x800) {
      c._0_4_ = (ushort)(CONCAT11(uVar5,(char)((uint)chr >> 6)) | 0xc0) & 0xffff3fff | 0x8000;
    }
    else if ((uint)chr < 0x10000) {
      c._0_4_ = (CONCAT12(uVar5,CONCAT11((char)((uint)chr >> 6),(char)((uint)chr >> 0xc))) &
                 0xff3fff | 0x80e0) & 0xff3fffff | 0x800000;
    }
    else {
      c._0_4_ = CONCAT13(uVar5,CONCAT12((char)((uint)chr >> 6),
                                        CONCAT11((char)((uint)chr >> 0xc),(char)((uint)chr >> 0x12))
                                       )) & 0x3f3f3fff | 0x808080f0;
    }
    if (*src == '\0') {
      return (void *)0x0;
    }
    pvVar2 = (void *)0x0;
    do {
      pvVar3 = src;
      src = (void *)((long)pvVar3 + -1);
      pcVar7 = c;
      do {
        pvVar4 = src;
        cVar6 = *(char *)((long)pvVar4 + 1);
        src = (void *)((long)pvVar4 + 1);
        cVar1 = *pcVar7;
        pcVar7 = pcVar7 + 1;
      } while (cVar6 == cVar1);
      if (cVar1 != '\0') {
        if (cVar6 == '\0') {
          return pvVar2;
        }
        cVar6 = *(char *)((long)pvVar4 + 2);
        src = (void *)((long)pvVar4 + 2);
        pvVar3 = pvVar2;
      }
      pvVar2 = pvVar3;
    } while (cVar6 != '\0');
  }
  return pvVar3;
}

Assistant:

void *utf8rchr(const void *src, int chr) {
  const char *s = (const char *)src;
  const char *match = 0;
  char c[5] = {'\0', '\0', '\0', '\0', '\0'};

  if (0 == chr) {
    // being asked to return position of null terminating byte, so
    // just run s to the end, and return!
    while ('\0' != *s) {
      s++;
    }
    return (void *)s;
  } else if (0 == ((int)0xffffff80 & chr)) {
    // 1-byte/7-bit ascii
    // (0b0xxxxxxx)
    c[0] = (char)chr;
  } else if (0 == ((int)0xfffff800 & chr)) {
    // 2-byte/11-bit utf8 code point
    // (0b110xxxxx 0b10xxxxxx)
    c[0] = 0xc0 | (char)(chr >> 6);
    c[1] = 0x80 | (char)(chr & 0x3f);
  } else if (0 == ((int)0xffff0000 & chr)) {
    // 3-byte/16-bit utf8 code point
    // (0b1110xxxx 0b10xxxxxx 0b10xxxxxx)
    c[0] = 0xe0 | (char)(chr >> 12);
    c[1] = 0x80 | (char)((chr >> 6) & 0x3f);
    c[2] = 0x80 | (char)(chr & 0x3f);
  } else { // if (0 == ((int)0xffe00000 & chr)) {
    // 4-byte/21-bit utf8 code point
    // (0b11110xxx 0b10xxxxxx 0b10xxxxxx 0b10xxxxxx)
    c[0] = 0xf0 | (char)(chr >> 18);
    c[1] = 0x80 | (char)((chr >> 12) & 0x3f);
    c[2] = 0x80 | (char)((chr >> 6) & 0x3f);
    c[3] = 0x80 | (char)(chr & 0x3f);
  }

  // we've created a 2 utf8 codepoint string in c that is
  // the utf8 character asked for by chr, and a null
  // terminating byte

  while ('\0' != *s) {
    size_t offset = 0;

    while (s[offset] == c[offset]) {
      offset++;
    }

    if ('\0' == c[offset]) {
      // we found a matching utf8 code point
      match = s;
      s += offset;
    } else {
      s += offset;

      // need to march s along to next utf8 codepoint start
      // (the next byte that doesn't match 0b10xxxxxx)
      if ('\0' != *s) {
        do {
          s++;
        } while (0x80 == (0xc0 & *s));
      }
    }
  }

  // return the last match we found (or 0 if no match was found)
  return (void *)match;
}